

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

void test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>>
               (Model *model,AttentionalModel<dynet::LSTMBuilder> *am,string *test_file,uint top_k)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  uint uVar1;
  bool bVar2;
  undefined1 uVar3;
  __type _Var4;
  ostream *poVar5;
  istream *piVar6;
  ulong uVar7;
  reference pvVar8;
  size_type sVar9;
  uint in_ECX;
  string *in_RDX;
  string word;
  string id;
  istringstream in_1;
  Sentence target;
  Sentence source;
  anon_class_40_5_ba08fbfd process;
  uint count;
  uint snum;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  last_items;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  items;
  string sep;
  string last_id;
  string line;
  ifstream in;
  uint lno;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  ostream *in_stack_fffffffffffff980;
  ostream *in_stack_fffffffffffff988;
  ostream *in_stack_fffffffffffff990;
  ostream *in_stack_fffffffffffff998;
  ostream *in_stack_fffffffffffff9a0;
  allocator_type *in_stack_fffffffffffff9a8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9b0;
  iterator in_stack_fffffffffffff9b8;
  size_type in_stack_fffffffffffff9c0;
  undefined7 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffa24;
  string local_598 [32];
  string local_578 [32];
  long local_558;
  anon_class_40_5_ba08fbfd *in_stack_fffffffffffffab0;
  int local_370;
  int local_36c;
  int *local_368;
  undefined8 local_360;
  int local_338;
  int local_334;
  int *local_330;
  undefined8 local_328;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_2b8;
  allocator local_299;
  string local_298 [32];
  string local_278 [32];
  string local_258 [48];
  long local_228 [65];
  uint local_20;
  uint local_1c;
  
  local_1c = in_ECX;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Reading test examples from ");
  poVar5 = std::operator<<(poVar5,in_RDX);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_20 = 0;
  std::ifstream::ifstream(local_228,in_RDX,_S_in);
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  uVar10 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa20);
  if (!bVar2) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.cc"
                  ,0x166,
                  "void test_kbest_arcs(Model &, AM_t &, string, unsigned int) [AM_t = dynet::AttentionalModel<dynet::LSTMBuilder>]"
                 );
  }
  std::__cxx11::string::string(local_258);
  std::__cxx11::string::string(local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"|||",&local_299);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            *)0x195825);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            *)0x195832);
  local_338 = kSRC_SOS;
  local_334 = kSRC_EOS;
  local_330 = &local_338;
  local_328 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x195883);
  __l._M_len = in_stack_fffffffffffff9c0;
  __l._M_array = in_stack_fffffffffffff9b8;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9b0,__l,in_stack_fffffffffffff9a8);
  local_370 = kTGT_SOS;
  local_36c = kTGT_EOS;
  local_368 = &local_370;
  local_360 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x1958fb);
  __l_00._M_len = in_stack_fffffffffffff9c0;
  __l_00._M_array = in_stack_fffffffffffff9b8;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9b0,__l_00,in_stack_fffffffffffff9a8);
  std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>::
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int,_true,_true>
            ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
              *)in_stack_fffffffffffff990,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
             (int *)in_stack_fffffffffffff978);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::push_back((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
  std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>::
  ~tuple((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
          *)0x19597e);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
  std::allocator<int>::~allocator((allocator<int> *)0x195998);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
  std::allocator<int>::~allocator((allocator<int> *)0x1959b2);
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_228,local_258);
    uVar3 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!(bool)uVar3) {
      bVar2 = std::
              vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
              ::empty((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       *)in_stack_fffffffffffff990);
      if (!bVar2) {
        test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>_>::anon_class_40_5_ba08fbfd::
        operator()(in_stack_fffffffffffffab0);
      }
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)in_stack_fffffffffffff990);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)in_stack_fffffffffffff990);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_258);
      std::ifstream::~ifstream(local_228);
      return;
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x195a68);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x195a75);
    std::__cxx11::istringstream::istringstream((istringstream *)&local_558,local_258,_S_in);
    std::__cxx11::string::string(local_578);
    std::__cxx11::string::string(local_598);
    piVar6 = std::operator>>((istream *)&local_558,local_578);
    std::operator>>(piVar6,local_598);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9a0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff998);
    if (!_Var4) {
      __assert_fail("word == sep",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.cc"
                    ,0x191,
                    "void test_kbest_arcs(Model &, AM_t &, string, unsigned int) [AM_t = dynet::AttentionalModel<dynet::LSTMBuilder>]"
                   );
    }
    while (bVar2 = std::ios::operator_cast_to_bool
                             ((ios *)((long)&local_558 + *(long *)(local_558 + -0x18))), bVar2) {
      std::operator>>((istream *)&local_558,local_598);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) != 0) ||
         (_Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff9a0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff998), _Var4)) break;
      dynet::Dict::convert((Dict *)CONCAT17(uVar3,in_stack_fffffffffffff9e8),(string *)piVar6);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
                 (value_type_conflict *)in_stack_fffffffffffff978);
      dynet::Dict::convert((Dict *)CONCAT17(uVar3,in_stack_fffffffffffff9e8),(string *)piVar6);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
                 (value_type_conflict *)in_stack_fffffffffffff978);
    }
    pvVar8 = std::vector<int,_std::allocator<int>_>::front
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980);
    if (((*pvVar8 != kSRC_SOS) &&
        (pvVar8 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980),
        *pvVar8 != kSRC_EOS)) ||
       ((pvVar8 = std::vector<int,_std::allocator<int>_>::front
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980),
        *pvVar8 != kTGT_SOS &&
        (pvVar8 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980),
        *pvVar8 != kTGT_EOS)))) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Sentence in ");
      poVar5 = std::operator<<(poVar5,in_RDX);
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20);
      std::operator<<(poVar5," didn\'t start or end with <s>, </s>\n");
      abort();
    }
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    if ((bVar2) &&
       (bVar2 = std::
                vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::empty((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                         *)in_stack_fffffffffffff990), !bVar2)) {
      sVar9 = std::
              vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
              ::size(&local_2b8);
      if (local_1c < sVar9) {
        std::
        vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::resize((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  *)in_stack_fffffffffffff9a0,(size_type)in_stack_fffffffffffff998);
      }
      test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>_>::anon_class_40_5_ba08fbfd::
      operator()(in_stack_fffffffffffffab0);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::operator=((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffa24,uVar10),
                  (vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   *)in_RDX);
      std::__cxx11::string::operator=(local_278,local_578);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::clear((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)0x195e9a);
      if ((verbose & 1U) != 0) {
        in_stack_fffffffffffff9a0 = std::operator<<((ostream *)&std::cerr,"chug ");
        uVar1 = local_20;
        local_20 = local_20 + 1;
        in_stack_fffffffffffff998 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9a0,uVar1);
        in_stack_fffffffffffff990 = std::operator<<(in_stack_fffffffffffff998," [");
        in_stack_fffffffffffff988 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff990,0)
        ;
        in_stack_fffffffffffff980 = std::operator<<(in_stack_fffffffffffff988," pairs]\r");
        std::ostream::operator<<(in_stack_fffffffffffff980,std::flush<char,std::char_traits<char>>);
      }
    }
    std::__cxx11::string::operator=(local_278,local_578);
    in_stack_fffffffffffffa24 = 0xffffffff;
    std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
    ::
    tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int,_true,_true>
              ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                *)in_stack_fffffffffffff990,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
               (int *)in_stack_fffffffffffff978);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::push_back((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
    std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
    ::~tuple((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
              *)0x195fc4);
    std::__cxx11::string::~string(local_598);
    std::__cxx11::string::~string(local_578);
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_558);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
  } while( true );
}

Assistant:

void test_kbest_arcs(Model &model, AM_t &am, string test_file, unsigned top_k)
{
    // only suitable for monolingual setting, of predicting a sentence given preceeding sentence
    cerr << "Reading test examples from " << test_file << endl;
    unsigned lno = 0;
    ifstream in(test_file);
    assert(in);
    string line, last_id;
    const std::string sep = "|||";
    vector<SentencePair> items, last_items;
    last_items.push_back(SentencePair(Sentence({ kSRC_SOS, kSRC_EOS }), Sentence({ kTGT_SOS, kTGT_EOS }), -1));
    unsigned snum = 0;
    unsigned count = 0;

    auto process = [&am, &snum, &last_items, &items, &count]() {
        for (unsigned i = 0; i < last_items.size(); ++i) {
            ComputationGraph cg;
            auto &source = get<0>(last_items[i]);
            am.start_new_instance(source, cg);

            for (unsigned j = 0; j < items.size(); ++j) {
                std::vector<Expression> errs;
                auto &target = get<1>(items[j]);
                const unsigned tlen = target.size() - 1;
                for (unsigned t = 0; t < tlen; ++t) {
                    Expression i_r_t = am.add_input(target[t], t, cg);
                    Expression i_err = pickneglogsoftmax(i_r_t, target[t+1]);
                    errs.push_back(i_err);
                }
                Expression i_nerr = sum(errs);
                double loss = as_scalar(cg.incremental_forward(i_nerr));

                //cout << last_last_id << ":" << last_id << " |||";
                //for (auto &w: source) cout << " " << sd.convert(w);
                //cout << " |||";
                //for (auto &w: target) cout << " " << td.convert(w);
                //cout << " ||| " << loss << "\n";
                cout << snum << '\t' << i << '\t' << j << '\t' << loss << '\n';
                ++count;
            }
        }
    };

    while (getline(in, line)) {
	Sentence source, target;

	istringstream in(line);
	string id, word;
	in >> id >> word;
	assert(word == sep);
	while(in) {
	    in >> word;
	    if (word.empty() || word == sep) break;
	    source.push_back(sd.convert(word));
	    target.push_back(td.convert(word));
	}

	if ((source.front() != kSRC_SOS && source.back() != kSRC_EOS) ||
		(target.front() != kTGT_SOS && target.back() != kTGT_EOS)) {
	    cerr << "Sentence in " << test_file << ":" << lno << " didn't start or end with <s>, </s>\n";
	    abort();
	}

	if (id != last_id && !items.empty()) {
	    if (items.size() > top_k)
		items.resize(top_k);

            process();

	    last_items = items;
	    last_id = id;
	    items.clear();
            snum++;

	    if (verbose)
		cerr << "chug " << lno++ << " [" << count << " pairs]\r" << flush;
	}

	last_id = id;
	items.push_back(SentencePair(source, target, -1));
    }
    
    if (!items.empty())
        process();

    return;
}